

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

void encode_longvarint(upb_encstate *e,uint64_t val)

{
  char *pcVar1;
  size_t __n;
  char *start;
  size_t len;
  uint64_t val_local;
  upb_encstate *e_local;
  
  if ((ulong)((long)e->ptr - (long)e->buf) < 10) {
    encode_growbuffer(e,10);
  }
  else {
    e->ptr = e->ptr + -10;
  }
  __n = encode_varint64(val,e->ptr);
  pcVar1 = e->ptr;
  memmove(pcVar1 + (10 - __n),e->ptr,__n);
  e->ptr = pcVar1 + (10 - __n);
  return;
}

Assistant:

UPB_NOINLINE
static void encode_longvarint(upb_encstate* e, uint64_t val) {
  size_t len;
  char* start;

  encode_reserve(e, UPB_PB_VARINT_MAX_LEN);
  len = encode_varint64(val, e->ptr);
  start = e->ptr + UPB_PB_VARINT_MAX_LEN - len;
  memmove(start, e->ptr, len);
  e->ptr = start;
}